

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Const.cpp
# Opt level: O1

void __thiscall chrono::ChFunction_Const::ArchiveOUT(ChFunction_Const *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChFunction_Const>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChFunction_Const::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Const>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(C);
}